

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

void __thiscall MiniScript::TestParser::TestValidParse(TestParser *this,String *src,bool dumpTac)

{
  Parser parser;
  String local_b8;
  Parser local_a8;
  
  Parser::Parser(&local_a8);
  String::String(&local_b8,src);
  Parser::Parse(&local_a8,&local_b8,false);
  String::~String(&local_b8);
  Parser::~Parser(&local_a8);
  return;
}

Assistant:

void TestParser::TestValidParse(String src, bool dumpTac) {
		Parser parser;
		try {
			parser.Parse(src);
		} catch (MiniscriptException& e) {
			std::cerr << e.Description().c_str() << " while parsing:" << std::endl;
			std::cerr << src.c_str() << std::endl;
		}
//		if (dumpTac && parser.output != null) TAC.Dump(parser.output.code);
	}